

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::Attribute::set_var(Attribute *this,PrimVar *v)

{
  string local_40;
  
  if ((this->_type_name)._M_string_length == 0) {
    primvar::PrimVar::type_name_abi_cxx11_(&local_40,v);
    std::__cxx11::string::operator=((string *)&this->_type_name,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  linb::any::operator=((any *)&this->_var,(any *)v);
  (this->_var)._blocked = v->_blocked;
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::_M_move_assign(&(this->_var)._ts._samples,&v->_ts);
  (this->_var)._ts._dirty = (v->_ts)._dirty;
  return;
}

Assistant:

void set_var(primvar::PrimVar &&v) {
    if (_type_name.empty()) {
      _type_name = v.type_name();
    }

    _var = std::move(v);
  }